

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iterator.h
# Opt level: O0

value_type * __thiscall
YAML::detail::iterator_base<YAML::detail::iterator_value>::operator*
          (iterator_base<YAML::detail::iterator_value> *this)

{
  value_type *in_RDI;
  value_type *v;
  shared_ptr<YAML::detail::memory_holder> *in_stack_fffffffffffffe88;
  Node *in_stack_fffffffffffffe90;
  Node *this_00;
  node *in_stack_fffffffffffffe98;
  iterator_value *in_stack_fffffffffffffea0;
  Node *this_01;
  Node *in_stack_fffffffffffffea8;
  iterator_value *in_stack_fffffffffffffeb0;
  Node local_130;
  Node *in_stack_ffffffffffffff28;
  iterator_value *in_stack_ffffffffffffff30;
  node_iterator_value<YAML::detail::node> local_30;
  node_iterator_value<YAML::detail::node> *local_18;
  
  node_iterator_base<YAML::detail::node>::operator*
            ((node_iterator_base<YAML::detail::node> *)in_stack_fffffffffffffeb0);
  local_18 = &local_30;
  if (local_30.pNode == (node *)0x0) {
    if ((local_30.super_pair<YAML::detail::node_*,_YAML::detail::node_*>.first == (node *)0x0) ||
       (local_30.super_pair<YAML::detail::node_*,_YAML::detail::node_*>.second == (node *)0x0)) {
      memset(in_RDI,0,0xc0);
      iterator_value::iterator_value(in_stack_fffffffffffffea0);
    }
    else {
      this_01 = (Node *)&stack0xffffffffffffff20;
      std::shared_ptr<YAML::detail::memory_holder>::shared_ptr
                ((shared_ptr<YAML::detail::memory_holder> *)in_stack_fffffffffffffe90,
                 in_stack_fffffffffffffe88);
      Node::Node(this_01,local_30.super_pair<YAML::detail::node_*,_YAML::detail::node_*>.first,
                 (shared_memory_holder *)in_stack_fffffffffffffe90);
      this_00 = &local_130;
      std::shared_ptr<YAML::detail::memory_holder>::shared_ptr
                ((shared_ptr<YAML::detail::memory_holder> *)this_00,
                 (shared_ptr<YAML::detail::memory_holder> *)
                 (local_18->super_pair<YAML::detail::node_*,_YAML::detail::node_*>).second);
      Node::Node(this_01,local_30.super_pair<YAML::detail::node_*,_YAML::detail::node_*>.first,
                 (shared_memory_holder *)this_00);
      iterator_value::iterator_value(in_stack_fffffffffffffeb0,in_stack_fffffffffffffea8,this_01);
      Node::~Node(this_00);
      std::shared_ptr<YAML::detail::memory_holder>::~shared_ptr
                ((shared_ptr<YAML::detail::memory_holder> *)0x9e24e6);
      Node::~Node(this_00);
      std::shared_ptr<YAML::detail::memory_holder>::~shared_ptr
                ((shared_ptr<YAML::detail::memory_holder> *)0x9e2500);
    }
  }
  else {
    node_iterator_value<YAML::detail::node>::operator*(local_18);
    std::shared_ptr<YAML::detail::memory_holder>::shared_ptr
              ((shared_ptr<YAML::detail::memory_holder> *)in_stack_fffffffffffffe90,
               in_stack_fffffffffffffe88);
    Node::Node(&in_stack_fffffffffffffea0->super_Node,in_stack_fffffffffffffe98,
               (shared_memory_holder *)in_stack_fffffffffffffe90);
    iterator_value::iterator_value(in_stack_ffffffffffffff30,in_stack_ffffffffffffff28);
    Node::~Node(in_stack_fffffffffffffe90);
    std::shared_ptr<YAML::detail::memory_holder>::~shared_ptr
              ((shared_ptr<YAML::detail::memory_holder> *)0x9e23c5);
  }
  return in_RDI;
}

Assistant:

value_type operator*() const {
    const typename base_type::value_type& v = *m_iterator;
    if (v.pNode)
      return value_type(Node(*v, m_pMemory));
    if (v.first && v.second)
      return value_type(Node(*v.first, m_pMemory), Node(*v.second, m_pMemory));
    return value_type();
  }